

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.cpp
# Opt level: O0

DeviceFeatures *
Diligent::EnableDeviceFeatures
          (DeviceFeatures *__return_storage_ptr__,DeviceFeatures *SupportedFeatures,
          DeviceFeatures *RequestedFeatures)

{
  undefined *puVar1;
  DEVICE_FEATURE_STATE DVar2;
  undefined8 uVar3;
  undefined1 local_38 [8];
  string _msg;
  DeviceFeatures *RequestedFeatures_local;
  DeviceFeatures *SupportedFeatures_local;
  
  _msg.field_2._8_8_ = RequestedFeatures;
  if ((SupportedFeatures->SeparablePrograms == DEVICE_FEATURE_STATE_ENABLED) &&
     (RequestedFeatures->SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED)) {
    FormatString<char[34]>((string *)local_38,(char (*) [34])"Can not disable SeparablePrograms");
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar3 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(0,uVar3,0);
    }
    std::__cxx11::string::~string((string *)local_38);
  }
  DeviceFeatures::DeviceFeatures(__return_storage_ptr__);
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)_msg.field_2._8_8_,
                          SupportedFeatures->SeparablePrograms,"Separable programs are");
  __return_storage_ptr__->SeparablePrograms = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 1),
                          SupportedFeatures->ShaderResourceQueries,"Shader resource queries are");
  __return_storage_ptr__->ShaderResourceQueries = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 2),
                          SupportedFeatures->WireframeFill,"Wireframe fill is");
  __return_storage_ptr__->WireframeFill = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 3),
                          SupportedFeatures->MultithreadedResourceCreation,
                          "Multithreaded resource creation is");
  __return_storage_ptr__->MultithreadedResourceCreation = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 4),
                          SupportedFeatures->ComputeShaders,"Compute shaders are");
  __return_storage_ptr__->ComputeShaders = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 5),
                          SupportedFeatures->GeometryShaders,"Geometry shaders are");
  __return_storage_ptr__->GeometryShaders = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 6),
                          SupportedFeatures->Tessellation,"Tessellation is");
  __return_storage_ptr__->Tessellation = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 7),
                          SupportedFeatures->MeshShaders,"Mesh shaders are");
  __return_storage_ptr__->MeshShaders = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 8),
                          SupportedFeatures->RayTracing,"Ray tracing is");
  __return_storage_ptr__->RayTracing = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 9),
                          SupportedFeatures->BindlessResources,"Bindless resources are");
  __return_storage_ptr__->BindlessResources = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 10),
                          SupportedFeatures->OcclusionQueries,"Occlusion queries are");
  __return_storage_ptr__->OcclusionQueries = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0xb),
                          SupportedFeatures->BinaryOcclusionQueries,"Binary occlusion queries are");
  __return_storage_ptr__->BinaryOcclusionQueries = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0xc),
                          SupportedFeatures->TimestampQueries,"Timestamp queries are");
  __return_storage_ptr__->TimestampQueries = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0xd),
                          SupportedFeatures->PipelineStatisticsQueries,
                          "Pipeline statistics queries are");
  __return_storage_ptr__->PipelineStatisticsQueries = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0xe),
                          SupportedFeatures->DurationQueries,"Duration queries are");
  __return_storage_ptr__->DurationQueries = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0xf),
                          SupportedFeatures->DepthBiasClamp,"Depth bias clamp is");
  __return_storage_ptr__->DepthBiasClamp = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0x10),
                          SupportedFeatures->DepthClamp,"Depth clamp is");
  __return_storage_ptr__->DepthClamp = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0x11),
                          SupportedFeatures->IndependentBlend,"Independent blend is");
  __return_storage_ptr__->IndependentBlend = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0x12),
                          SupportedFeatures->DualSourceBlend,"Dual-source blend is");
  __return_storage_ptr__->DualSourceBlend = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0x13),
                          SupportedFeatures->MultiViewport,"Multiviewport is");
  __return_storage_ptr__->MultiViewport = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0x14),
                          SupportedFeatures->TextureCompressionBC,"BC texture compression is");
  __return_storage_ptr__->TextureCompressionBC = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0x15),
                          SupportedFeatures->TextureCompressionETC2,"ETC texture compression is");
  __return_storage_ptr__->TextureCompressionETC2 = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0x16),
                          SupportedFeatures->VertexPipelineUAVWritesAndAtomics,
                          "Vertex pipeline UAV writes and atomics are");
  __return_storage_ptr__->VertexPipelineUAVWritesAndAtomics = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0x17),
                          SupportedFeatures->PixelUAVWritesAndAtomics,
                          "Pixel UAV writes and atomics are");
  __return_storage_ptr__->PixelUAVWritesAndAtomics = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0x18),
                          SupportedFeatures->TextureUAVExtendedFormats,
                          "Texture UAV extended formats are");
  __return_storage_ptr__->TextureUAVExtendedFormats = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0x19),
                          SupportedFeatures->ShaderFloat16,"16-bit float shader operations are");
  __return_storage_ptr__->ShaderFloat16 = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0x1a),
                          SupportedFeatures->ResourceBuffer16BitAccess,
                          "16-bit resource buffer access is");
  __return_storage_ptr__->ResourceBuffer16BitAccess = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0x1b),
                          SupportedFeatures->UniformBuffer16BitAccess,
                          "16-bit uniform buffer access is");
  __return_storage_ptr__->UniformBuffer16BitAccess = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0x1c),
                          SupportedFeatures->ShaderInputOutput16,"16-bit shader inputs/outputs are")
  ;
  __return_storage_ptr__->ShaderInputOutput16 = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0x1d),
                          SupportedFeatures->ShaderInt8,"8-bit int shader operations are");
  __return_storage_ptr__->ShaderInt8 = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0x1e),
                          SupportedFeatures->ResourceBuffer8BitAccess,
                          "8-bit resource buffer access is");
  __return_storage_ptr__->ResourceBuffer8BitAccess = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0x1f),
                          SupportedFeatures->UniformBuffer8BitAccess,
                          "8-bit uniform buffer access is");
  __return_storage_ptr__->UniformBuffer8BitAccess = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0x20),
                          SupportedFeatures->ShaderResourceStaticArrays,
                          "Shader resource static arrays are");
  __return_storage_ptr__->ShaderResourceStaticArrays = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0x21),
                          SupportedFeatures->ShaderResourceRuntimeArrays,
                          "Shader resource runtime arrays are");
  __return_storage_ptr__->ShaderResourceRuntimeArrays = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0x22),
                          SupportedFeatures->WaveOp,"Wave operations are");
  __return_storage_ptr__->WaveOp = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0x23),
                          SupportedFeatures->InstanceDataStepRate,"Instance data step rate is");
  __return_storage_ptr__->InstanceDataStepRate = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0x24),
                          SupportedFeatures->NativeFence,"Native fence is");
  __return_storage_ptr__->NativeFence = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0x25),
                          SupportedFeatures->TileShaders,"Tile shaders are");
  __return_storage_ptr__->TileShaders = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0x26),
                          SupportedFeatures->TransferQueueTimestampQueries,
                          "Timestamp queries in transfer queues are");
  __return_storage_ptr__->TransferQueueTimestampQueries = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0x27),
                          SupportedFeatures->VariableRateShading,"Variable shading rate is");
  __return_storage_ptr__->VariableRateShading = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0x28),
                          SupportedFeatures->SparseResources,"Sparse resources are");
  __return_storage_ptr__->SparseResources = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0x29),
                          SupportedFeatures->SubpassFramebufferFetch,"Subpass framebuffer fetch is")
  ;
  __return_storage_ptr__->SubpassFramebufferFetch = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0x2a),
                          SupportedFeatures->TextureComponentSwizzle,"Texture component swizzle is")
  ;
  __return_storage_ptr__->TextureComponentSwizzle = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0x2b),
                          SupportedFeatures->TextureSubresourceViews,"Texture subresource views are"
                         );
  __return_storage_ptr__->TextureSubresourceViews = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0x2c),
                          SupportedFeatures->NativeMultiDraw,"Native multi-draw commands are");
  __return_storage_ptr__->NativeMultiDraw = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0x2d),
                          SupportedFeatures->AsyncShaderCompilation,"Async shader compilation is");
  __return_storage_ptr__->AsyncShaderCompilation = DVar2;
  DVar2 = GetFeatureState(*(DEVICE_FEATURE_STATE *)(_msg.field_2._8_8_ + 0x2e),
                          SupportedFeatures->FormattedBuffers,"Formatted buffers are");
  __return_storage_ptr__->FormattedBuffers = DVar2;
  return __return_storage_ptr__;
}

Assistant:

DeviceFeatures EnableDeviceFeatures(const DeviceFeatures& SupportedFeatures,
                                    const DeviceFeatures& RequestedFeatures) noexcept(false)
{
    if (SupportedFeatures.SeparablePrograms == DEVICE_FEATURE_STATE_ENABLED &&
        RequestedFeatures.SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED)
    {
        LOG_INFO_MESSAGE("Can not disable SeparablePrograms");
    }

    DeviceFeatures EnabledFeatures;

    // clang-format off
    ENABLE_FEATURE(SeparablePrograms,                 "Separable programs are");
    ENABLE_FEATURE(ShaderResourceQueries,             "Shader resource queries are");
    ENABLE_FEATURE(WireframeFill,                     "Wireframe fill is");
    ENABLE_FEATURE(MultithreadedResourceCreation,     "Multithreaded resource creation is");
    ENABLE_FEATURE(ComputeShaders,                    "Compute shaders are");
    ENABLE_FEATURE(GeometryShaders,                   "Geometry shaders are");
    ENABLE_FEATURE(Tessellation,                      "Tessellation is");
    ENABLE_FEATURE(MeshShaders,                       "Mesh shaders are");
    ENABLE_FEATURE(RayTracing,                        "Ray tracing is");
    ENABLE_FEATURE(BindlessResources,                 "Bindless resources are");
    ENABLE_FEATURE(OcclusionQueries,                  "Occlusion queries are");
    ENABLE_FEATURE(BinaryOcclusionQueries,            "Binary occlusion queries are");
    ENABLE_FEATURE(TimestampQueries,                  "Timestamp queries are");
    ENABLE_FEATURE(PipelineStatisticsQueries,         "Pipeline statistics queries are");
    ENABLE_FEATURE(DurationQueries,                   "Duration queries are");
    ENABLE_FEATURE(DepthBiasClamp,                    "Depth bias clamp is");
    ENABLE_FEATURE(DepthClamp,                        "Depth clamp is");
    ENABLE_FEATURE(IndependentBlend,                  "Independent blend is");
    ENABLE_FEATURE(DualSourceBlend,                   "Dual-source blend is");
    ENABLE_FEATURE(MultiViewport,                     "Multiviewport is");
    ENABLE_FEATURE(TextureCompressionBC,              "BC texture compression is");
    ENABLE_FEATURE(TextureCompressionETC2,            "ETC texture compression is");
    ENABLE_FEATURE(VertexPipelineUAVWritesAndAtomics, "Vertex pipeline UAV writes and atomics are");
    ENABLE_FEATURE(PixelUAVWritesAndAtomics,          "Pixel UAV writes and atomics are");
    ENABLE_FEATURE(TextureUAVExtendedFormats,         "Texture UAV extended formats are");
    ENABLE_FEATURE(ShaderFloat16,                     "16-bit float shader operations are");
    ENABLE_FEATURE(ResourceBuffer16BitAccess,         "16-bit resource buffer access is");
    ENABLE_FEATURE(UniformBuffer16BitAccess,          "16-bit uniform buffer access is");
    ENABLE_FEATURE(ShaderInputOutput16,               "16-bit shader inputs/outputs are");
    ENABLE_FEATURE(ShaderInt8,                        "8-bit int shader operations are");
    ENABLE_FEATURE(ResourceBuffer8BitAccess,          "8-bit resource buffer access is");
    ENABLE_FEATURE(UniformBuffer8BitAccess,           "8-bit uniform buffer access is");
    ENABLE_FEATURE(ShaderResourceStaticArrays,        "Shader resource static arrays are");
    ENABLE_FEATURE(ShaderResourceRuntimeArrays,       "Shader resource runtime arrays are");
    ENABLE_FEATURE(WaveOp,                            "Wave operations are");
    ENABLE_FEATURE(InstanceDataStepRate,              "Instance data step rate is");
    ENABLE_FEATURE(NativeFence,                       "Native fence is");
    ENABLE_FEATURE(TileShaders,                       "Tile shaders are");
    ENABLE_FEATURE(TransferQueueTimestampQueries,     "Timestamp queries in transfer queues are");
    ENABLE_FEATURE(VariableRateShading,               "Variable shading rate is");
    ENABLE_FEATURE(SparseResources,                   "Sparse resources are");
    ENABLE_FEATURE(SubpassFramebufferFetch,           "Subpass framebuffer fetch is");
    ENABLE_FEATURE(TextureComponentSwizzle,           "Texture component swizzle is");
    ENABLE_FEATURE(TextureSubresourceViews,           "Texture subresource views are");
    ENABLE_FEATURE(NativeMultiDraw,                   "Native multi-draw commands are");
    ENABLE_FEATURE(AsyncShaderCompilation,            "Async shader compilation is");
    ENABLE_FEATURE(FormattedBuffers,                  "Formatted buffers are");
    // clang-format on

    ASSERT_SIZEOF(DeviceFeatures, 47, "Did you add a new feature to DeviceFeatures? Please handle its status here (if necessary).");

    return EnabledFeatures;
}